

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddNormal
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals,
          bool pNormalPerVertex)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  size_type sVar5;
  DeadlyImportError *pDVar6;
  ulong uVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  reference paVar10;
  aiVector3t<float> *local_118;
  aiVector3t<float> *local_e0;
  size_t vi_e;
  size_t vi;
  size_t fi;
  string local_98;
  _List_const_iterator<aiVector3t<float>_> local_78;
  ulong local_70;
  size_t i;
  allocator local_51;
  string local_50;
  _List_const_iterator<aiVector3t<float>_> local_30;
  const_iterator norm_it;
  bool pNormalPerVertex_local;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pNormals_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  norm_it._M_node._7_1_ = pNormalPerVertex;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin(pNormals);
  if ((norm_it._M_node._7_1_ & 1) == 0) {
    sVar5 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (pNormals);
    if (sVar5 != pMesh->mNumFaces) {
      fi._6_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,
                 "MeshGeometry_AddNormal. Normals and faces count must be equal.",
                 (allocator *)((long)&fi + 7));
      DeadlyImportError::DeadlyImportError(pDVar6,&local_98);
      fi._6_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar7 = CONCAT44(0,pMesh->mNumVertices);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_118 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_118);
        local_118 = local_118 + 1;
      } while (local_118 != paVar9 + uVar7);
    }
    pMesh->mNormals = paVar9;
    for (vi = 0; vi < pMesh->mNumFaces; vi = vi + 1) {
      vi_e = 0;
      uVar1 = pMesh->mFaces[vi].mNumIndices;
      for (; vi_e < uVar1; vi_e = vi_e + 1) {
        paVar10 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_30);
        paVar9 = pMesh->mNormals + pMesh->mFaces[vi].mIndices[vi_e];
        fVar4 = paVar10->y;
        paVar9->x = paVar10->x;
        paVar9->y = fVar4;
        paVar9->z = paVar10->z;
      }
      std::_List_const_iterator<aiVector3t<float>_>::operator++(&local_30);
    }
  }
  else {
    sVar5 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (pNormals);
    if (sVar5 != pMesh->mNumVertices) {
      i._3_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_50,
                 "MeshGeometry_AddNormal. Normals and vertices count must be equal.",&local_51);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_50);
      i._3_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    uVar7 = CONCAT44(0,pMesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    uVar8 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_e0 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_e0);
        local_e0 = local_e0 + 1;
      } while (local_e0 != paVar9 + uVar7);
    }
    pMesh->mNormals = paVar9;
    for (local_70 = 0; local_70 < pMesh->mNumVertices; local_70 = local_70 + 1) {
      local_78._M_node =
           (_List_node_base *)std::_List_const_iterator<aiVector3t<float>_>::operator++(&local_30,0)
      ;
      paVar10 = std::_List_const_iterator<aiVector3t<float>_>::operator*(&local_78);
      paVar9 = pMesh->mNormals + local_70;
      fVar4 = paVar10->y;
      paVar9->x = paVar10->x;
      paVar9->y = fVar4;
      paVar9->z = paVar10->z;
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddNormal(aiMesh& pMesh, const std::list<aiVector3D>& pNormals, const bool pNormalPerVertex) const
{
    std::list<aiVector3D>::const_iterator norm_it = pNormals.begin();

	if(pNormalPerVertex)
	{
		if(pNormals.size() != pMesh.mNumVertices) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and vertices count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mNormals[i] = *norm_it++;
	}// if(pNormalPerVertex)
	else
	{
		if(pNormals.size() != pMesh.mNumFaces) throw DeadlyImportError("MeshGeometry_AddNormal. Normals and faces count must be equal.");

		// copy normals to mesh
		pMesh.mNormals = new aiVector3D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
			for(size_t vi = 0, vi_e = pMesh.mFaces[fi].mNumIndices; vi < vi_e; vi++) pMesh.mNormals[pMesh.mFaces[fi].mIndices[vi]] = *norm_it;

			++norm_it;
		}
	}// if(pNormalPerVertex) else
}